

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

StringReader * __thiscall
phosg::StringReader::sub
          (StringReader *__return_storage_ptr__,StringReader *this,size_t offset,size_t size)

{
  ulong uVar1;
  
  uVar1 = this->length;
  if (uVar1 < offset || uVar1 - offset == 0) {
    StringReader(__return_storage_ptr__);
  }
  else {
    if (uVar1 < size + offset) {
      size = uVar1 - offset;
    }
    StringReader(__return_storage_ptr__,this->data + offset,size,0);
  }
  return __return_storage_ptr__;
}

Assistant:

StringReader StringReader::sub(size_t offset, size_t size) const {
  if (offset >= this->length) {
    return StringReader();
  }
  if (offset + size > this->length) {
    return StringReader(
        reinterpret_cast<const char*>(this->data) + offset,
        this->length - offset);
  }
  return StringReader(reinterpret_cast<const char*>(this->data) + offset, size);
}